

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getTransitionMatrix
          (BeagleCPUImpl<float,_1,_0> *this,int matrixIndex,double *outMatrix)

{
  ulong uVar1;
  int i;
  int iVar2;
  int iVar3;
  float *from;
  
  from = this->gTransitionMatrices[matrixIndex];
  for (iVar2 = 0; iVar2 < this->kCategoryCount; iVar2 = iVar2 + 1) {
    uVar1 = (ulong)(uint)this->kStateCount;
    for (iVar3 = 0; iVar3 < (int)(uint)uVar1; iVar3 = iVar3 + 1) {
      beagleMemCpy<double,float>(outMatrix,from,(uint)uVar1);
      uVar1 = (ulong)this->kStateCount;
      from = from + this->kTransPaddedStateCount;
      outMatrix = outMatrix + uVar1;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getTransitionMatrix(int matrixIndex,
                                                 double* outMatrix) {
    // TODO Test with multiple rate categories
if (T_PAD != 0) {
    double* offsetOutMatrix = outMatrix;
    REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
    for(int i = 0; i < kCategoryCount; i++) {
        for(int j = 0; j < kStateCount; j++) {
            beagleMemCpy(offsetOutMatrix,offsetBeagleMatrix,kStateCount);
            offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
            offsetOutMatrix += kStateCount;
        }
    }
} else {
    beagleMemCpy(outMatrix,gTransitionMatrices[matrixIndex],
            kMatrixSize * kCategoryCount);
}
    return BEAGLE_SUCCESS;
}